

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CmdLineParser.h
# Opt level: O0

bool __thiscall
axl::sl::CmdLineParser<CmdLineParser,_CmdLineSwitchTable>::processSwitch
          (CmdLineParser<CmdLineParser,_CmdLineSwitchTable> *this,SwitchInfo *switchInfo,
          StringRef *switchName,StringRef *value)

{
  undefined1 uVar1;
  bool bVar2;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RCX;
  long in_RSI;
  StringRef *in_RDI;
  CmdLineParser *self;
  bool result;
  StringRef *in_stack_ffffffffffffffb8;
  StringRef *pSVar3;
  undefined7 in_stack_ffffffffffffffd0;
  bool local_1;
  SwitchKind switchKind;
  
  pSVar3 = in_RDI;
  uVar1 = checkMissingValue((CmdLineParser<CmdLineParser,_CmdLineSwitchTable> *)
                            in_stack_ffffffffffffffb8);
  switchKind = (SwitchKind)((ulong)pSVar3 >> 0x20);
  if ((bool)uVar1) {
    if ((*(long *)(in_RSI + 0x38) == 0) ||
       (bVar2 = StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::isEmpty(in_RCX), !bVar2)) {
      local_1 = ::CmdLineParser::onSwitch
                          ((CmdLineParser *)CONCAT17(uVar1,in_stack_ffffffffffffffd0),switchKind,
                           in_RDI);
    }
    else {
      *(undefined4 *)
       ((long)&((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)&in_RDI->m_p)->m_p + 4) =
           *(undefined4 *)(in_RSI + 0x10);
      StringBase<char,_axl::sl::StringDetailsBase<char>_>::operator=
                ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)in_RDI,
                 in_stack_ffffffffffffffb8);
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
	processSwitch(
		const SwitchInfo* switchInfo,
		const sl::StringRef& switchName,
		const sl::StringRef& value
	) {
		bool result;

		T* self = static_cast<T*>(this);

		result = checkMissingValue();
		if (!result)
			return false;

		if (switchInfo->m_value && value.isEmpty()) {
			m_valueSwitchKind = switchInfo->m_switchKind;
			m_valueSwitchName = switchName;
			return true;
		}

		return self->onSwitch((SwitchKind)switchInfo->m_switchKind, value);
	}